

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O2

void __thiscall features::Sift::create_octaves(Sift *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  float fVar1;
  int iVar2;
  int iVar3;
  __shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_58 [8];
  ConstPtr pre_base;
  ConstPtr img;
  
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::clear
            (&this->octaves);
  if ((this->options).min_octave < 0) {
    std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,
               &(this->orig).
                super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
    core::image::rescale_double_size_supersample<float>
              ((image *)&pre_base.
                         super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(ConstPtr *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              (local_98,(__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
                        &pre_base.
                         super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    fVar1 = (this->options).inherent_blur_sigma;
    add_octave(this,(ConstPtr *)local_98,fVar1 + fVar1,(this->options).base_blur_sigma);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
  }
  this_00 = &pre_base.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &(this->orig).super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)
  ;
  for (iVar3 = 0; iVar2 = (this->options).min_octave, iVar3 < iVar2; iVar3 = iVar3 + 1) {
    std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               (__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)this_00);
    core::image::rescale_half_size_gaussian<float>
              ((image *)local_58,(ConstPtr *)&local_88,0.8660254);
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)this_00,
               (__shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pre_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  }
  img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = (this->options).inherent_blur_sigma;
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  for (; iVar3 <= (this->options).max_octave; iVar3 = iVar3 + 1) {
    std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,
               (__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)
               &pre_base.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    add_octave(this,(ConstPtr *)&local_78,
               img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,(this->options).base_blur_sigma);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<core::Image<float>,void>
              ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)local_58,
               &((this->octaves).
                 super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].img.
                 super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,
               (__shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    core::image::rescale_half_size_gaussian<float>
              ((image *)&local_b8,(ConstPtr *)&local_68,0.8660254);
    std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> *)
               &pre_base.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    img.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = (this->options).base_blur_sigma;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pre_base);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&img);
  return;
}

Assistant:

void
Sift::create_octaves (void)
{
    this->octaves.clear();

    /*
     * Create octave -1. The original image is assumed to have blur
     * sigma = 0.5. The double size image therefore has sigma = 1.
     */
    if (this->options.min_octave < 0)
    {
        //std::cout << "Creating octave -1..." << std::endl;
        core::FloatImage::Ptr img
            = core::image::rescale_double_size_supersample<float>(this->orig);
        this->add_octave(img, this->options.inherent_blur_sigma * 2.0f,
            this->options.base_blur_sigma);
    }

    /*
     * Prepare image for the first positive octave by downsampling.
     * This code is executed only if min_octave > 0.
     */
    core::FloatImage::ConstPtr img = this->orig;
    for (int i = 0; i < this->options.min_octave; ++i)
        img = core::image::rescale_half_size_gaussian<float>(img);

    /*
     * Create new octave from 'img', then subsample octave image where
     * sigma is doubled to get a new base image for the next octave.
     */
    float img_sigma = this->options.inherent_blur_sigma;
    for (int i = std::max(0, this->options.min_octave);
        i <= this->options.max_octave; ++i)
    {
        //std::cout << "Creating octave " << i << "..." << std::endl;
        this->add_octave(img, img_sigma, this->options.base_blur_sigma);

        core::FloatImage::ConstPtr pre_base = octaves[octaves.size()-1].img[0];
        img = core::image::rescale_half_size_gaussian<float>(pre_base);

        img_sigma = this->options.base_blur_sigma;
    }
}